

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O2

void __thiscall MeshDenoisingViaL0Minimization::initParameters(MeshDenoisingViaL0Minimization *this)

{
  ParameterSet *pPVar1;
  MeshDenoisingViaL0Minimization *this_00;
  double dVar2;
  undefined1 local_278 [8];
  TriMesh mesh;
  string local_40;
  allocator local_19;
  
  ParameterSet::removeAllParameter((this->super_MeshDenoisingBase).parameter_set_);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)local_278,"mu_beta",(allocator *)&local_40);
  ParameterSet::addParameter(pPVar1,(string *)local_278,1.414);
  std::__cxx11::string::~string((string *)local_278);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)local_278,"beta",(allocator *)&local_40);
  ParameterSet::addParameter(pPVar1,(string *)local_278,0.001);
  std::__cxx11::string::~string((string *)local_278);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)local_278,"beta_max",(allocator *)&local_40);
  ParameterSet::addParameter(pPVar1,(string *)local_278,1000.0);
  std::__cxx11::string::~string((string *)local_278);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)local_278,"mu_alpha",(allocator *)&local_40);
  ParameterSet::addParameter(pPVar1,(string *)local_278,0.5);
  std::__cxx11::string::~string((string *)local_278);
  OpenMesh::TriMesh_ArrayKernelT<MyTraits>::TriMesh_ArrayKernelT
            ((TriMesh_ArrayKernelT<MyTraits> *)local_278,
             &((this->super_MeshDenoisingBase).data_manager_)->noisy_mesh_);
  if (mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _168_8_ ==
      mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _160_8_) {
    pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
    std::__cxx11::string::string((string *)&local_40,"alpha",&local_19);
    ParameterSet::addParameter(pPVar1,&local_40,0.0001);
    std::__cxx11::string::~string((string *)&local_40);
    pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
    std::__cxx11::string::string((string *)&local_40,"lambda",&local_19);
    ParameterSet::addParameter(pPVar1,&local_40,0.0001);
  }
  else {
    this_00 = this;
    mesh.super_Mesh.
    super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
    .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
    _544_8_ = MeshDenoisingBase::getAverageEdgeLength
                        (&this->super_MeshDenoisingBase,(TriMesh *)local_278);
    dVar2 = getAverageDihedralAngle(this_00,(TriMesh *)local_278);
    pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
    std::__cxx11::string::string((string *)&local_40,"alpha",&local_19);
    ParameterSet::addParameter(pPVar1,&local_40,dVar2 * 0.1);
    std::__cxx11::string::~string((string *)&local_40);
    pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
    std::__cxx11::string::string((string *)&local_40,"lambda",&local_19);
    ParameterSet::addParameter
              (pPVar1,&local_40,
               (double)mesh.super_Mesh.
                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                       .
                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       ._544_8_ * 0.2 *
               (double)mesh.super_Mesh.
                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                       .
                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       ._544_8_ * dVar2);
  }
  std::__cxx11::string::~string((string *)&local_40);
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_278);
  return;
}

Assistant:

void MeshDenoisingViaL0Minimization::initParameters()
{
    parameter_set_->removeAllParameter();

    parameter_set_->addParameter(string("mu_beta"), 1.414);
    parameter_set_->addParameter(string("beta"), 0.001);
    parameter_set_->addParameter(string("beta_max"), 1000.0);
    parameter_set_->addParameter(string("mu_alpha"), 0.5);

    TriMesh mesh = data_manager_->getNoisyMesh();
    if(mesh.n_vertices() == 0)
    {
        parameter_set_->addParameter(string("alpha"), 0.0001);
        parameter_set_->addParameter(string("lambda"), 0.0001);
    }
    else
    {
        double mean_edge_length = getAverageEdgeLength(mesh);
        double mean_dihedral_angle = getAverageDihedralAngle(mesh);
        parameter_set_->addParameter(string("alpha"), 0.1 * mean_dihedral_angle);
        parameter_set_->addParameter(string("lambda"), 0.2 * mean_edge_length * mean_edge_length * mean_dihedral_angle);
    }

}